

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader14.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::MeshLoader14::begin__trifans(MeshLoader14 *this)

{
  trifans__AttributeData *in_stack_00000028;
  MeshLoader14 *in_stack_00000030;
  
  begin__trifans(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

bool MeshLoader14::begin__trifans( const COLLADASaxFWL14::trifans__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__trifans(attributeData));
COLLADASaxFWL::trifans__AttributeData attrData;
attrData.present_attributes = 0;
attrData.name = attributeData.name;
attrData.material = attributeData.material;
if ( (attributeData.present_attributes & COLLADASaxFWL14::trifans__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL14::trifans__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::trifans__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__trifans(attrData);
}